

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.h
# Opt level: O0

void __thiscall ast::Conditional_expression::~Conditional_expression(Conditional_expression *this)

{
  Conditional_expression *this_local;
  
  (this->super_Expression)._vptr_Expression = (_func_int **)&PTR__Conditional_expression_0017ebd8;
  if (this->logical_expression != (Expression *)0x0) {
    (*this->logical_expression->_vptr_Expression[1])();
  }
  if (this->true_expression != (Expression *)0x0) {
    (*this->true_expression->_vptr_Expression[1])();
  }
  if (this->false_expression != (Expression *)0x0) {
    (*this->false_expression->_vptr_Expression[1])();
  }
  Expression::~Expression(&this->super_Expression);
  return;
}

Assistant:

virtual ~Conditional_expression() {
		 delete logical_expression;
		 delete true_expression;
		 delete false_expression;
	}